

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O0

void ImPlot::PlotHeatmap<unsigned_short>
               (char *label_id,unsigned_short *values,int rows,int cols,double scale_min,
               double scale_max,char *fmt,ImPlotPoint *bounds_min,ImPlotPoint *bounds_max)

{
  bool bVar1;
  ImPlotScale IVar2;
  TransformerLogLog local_58;
  TransformerLinLog local_54;
  TransformerLogLin local_50;
  TransformerLinLin local_4c;
  ImDrawList *local_48;
  ImDrawList *DrawList;
  ImPlotPoint *bounds_min_local;
  char *fmt_local;
  double scale_max_local;
  double scale_min_local;
  int cols_local;
  int rows_local;
  unsigned_short *values_local;
  char *label_id_local;
  
  DrawList = (ImDrawList *)bounds_min;
  bounds_min_local = (ImPlotPoint *)fmt;
  fmt_local = (char *)scale_max;
  scale_max_local = scale_min;
  scale_min_local._0_4_ = cols;
  scale_min_local._4_4_ = rows;
  _cols_local = values;
  values_local = (unsigned_short *)label_id;
  bVar1 = BeginItem(label_id,-1);
  if (bVar1) {
    bVar1 = FitThisFrame();
    if (bVar1) {
      FitPoint((ImPlotPoint *)DrawList);
      FitPoint(bounds_max);
    }
    local_48 = GetPlotDrawList();
    IVar2 = GetCurrentScale();
    switch(IVar2) {
    case 0:
      TransformerLinLin::TransformerLinLin(&local_4c);
      RenderHeatmap<unsigned_short,ImPlot::TransformerLinLin>
                (local_4c,local_48,_cols_local,scale_min_local._4_4_,scale_min_local._0_4_,
                 scale_max_local,(double)fmt_local,(char *)bounds_min_local,(ImPlotPoint *)DrawList,
                 bounds_max,true);
      break;
    case 1:
      TransformerLogLin::TransformerLogLin(&local_50);
      RenderHeatmap<unsigned_short,ImPlot::TransformerLogLin>
                (local_50,local_48,_cols_local,scale_min_local._4_4_,scale_min_local._0_4_,
                 scale_max_local,(double)fmt_local,(char *)bounds_min_local,(ImPlotPoint *)DrawList,
                 bounds_max,true);
      break;
    case 2:
      TransformerLinLog::TransformerLinLog(&local_54);
      RenderHeatmap<unsigned_short,ImPlot::TransformerLinLog>
                (local_54,local_48,_cols_local,scale_min_local._4_4_,scale_min_local._0_4_,
                 scale_max_local,(double)fmt_local,(char *)bounds_min_local,(ImPlotPoint *)DrawList,
                 bounds_max,true);
      break;
    case 3:
      TransformerLogLog::TransformerLogLog(&local_58);
      RenderHeatmap<unsigned_short,ImPlot::TransformerLogLog>
                (local_58,local_48,_cols_local,scale_min_local._4_4_,scale_min_local._0_4_,
                 scale_max_local,(double)fmt_local,(char *)bounds_min_local,(ImPlotPoint *)DrawList,
                 bounds_max,true);
    }
    EndItem();
  }
  return;
}

Assistant:

void PlotHeatmap(const char* label_id, const T* values, int rows, int cols, double scale_min, double scale_max, const char* fmt, const ImPlotPoint& bounds_min, const ImPlotPoint& bounds_max) {
    if (BeginItem(label_id)) {
        if (FitThisFrame()) {
            FitPoint(bounds_min);
            FitPoint(bounds_max);
        }
        ImDrawList& DrawList = *GetPlotDrawList();
        switch (GetCurrentScale()) {
            case ImPlotScale_LinLin: RenderHeatmap(TransformerLinLin(), DrawList, values, rows, cols, scale_min, scale_max, fmt, bounds_min, bounds_max, true); break;
            case ImPlotScale_LogLin: RenderHeatmap(TransformerLogLin(), DrawList, values, rows, cols, scale_min, scale_max, fmt, bounds_min, bounds_max, true); break;
            case ImPlotScale_LinLog: RenderHeatmap(TransformerLinLog(), DrawList, values, rows, cols, scale_min, scale_max, fmt, bounds_min, bounds_max, true); break;
            case ImPlotScale_LogLog: RenderHeatmap(TransformerLogLog(), DrawList, values, rows, cols, scale_min, scale_max, fmt, bounds_min, bounds_max, true); break;
        }
        EndItem();
    }
}